

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_WriteBlifInt(Abc_Ntk_t *pNtk,char *FileName,char *pLutStruct,int fUseHie)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *vCover_00;
  int local_4c;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pNode;
  Vec_Int_t *vCover;
  FILE *pFile;
  int fUseHie_local;
  char *pLutStruct_local;
  char *FileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlif.c"
                  ,0x526,"void Io_WriteBlifInt(Abc_Ntk_t *, char *, char *, int)");
  }
  __stream = fopen(FileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteBlifInt(): Cannot open the output file.\n");
  }
  else {
    pcVar3 = pNtk->pName;
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar3,pcVar2);
    pcVar3 = Abc_NtkName(pNtk);
    fprintf(__stream,".model %s\n",pcVar3);
    fprintf(__stream,".inputs");
    Io_NtkWritePis((FILE *)__stream,pNtk,1);
    fprintf(__stream,"\n");
    fprintf(__stream,".outputs");
    Io_NtkWritePos((FILE *)__stream,pNtk,1);
    fprintf(__stream,"\n");
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (iVar1 != 0) {
      fprintf(__stream,"\n");
    }
    for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_4c);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        Io_NtkWriteLatch((FILE *)__stream,pAVar4);
      }
    }
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (iVar1 != 0) {
      fprintf(__stream,"\n");
    }
    vCover_00 = Vec_IntAlloc(0x10000);
    if (fUseHie == 0) {
      for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_4c < iVar1; local_4c = local_4c + 1
          ) {
        pAVar4 = Abc_NtkObj(pNtk,local_4c);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
          if (pLutStruct == (char *)0x0) {
            Io_NtkWriteNodeInt((FILE *)__stream,pAVar4,vCover_00);
          }
          else {
            Io_NtkWriteNodeIntStruct((FILE *)__stream,pAVar4,vCover_00,pLutStruct);
          }
        }
      }
      fprintf(__stream,".end\n\n");
    }
    else {
      fprintf(__stream,"\n");
      for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_4c < iVar1; local_4c = local_4c + 1
          ) {
        pAVar4 = Abc_NtkObj(pNtk,local_4c);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
          Io_NtkWriteNodeSubckt((FILE *)__stream,pAVar4,0);
        }
      }
      fprintf(__stream,".end\n\n");
      for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_4c < iVar1; local_4c = local_4c + 1
          ) {
        pAVar4 = Abc_NtkObj(pNtk,local_4c);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
          Io_NtkWriteModelIntStruct((FILE *)__stream,pAVar4,vCover_00,pLutStruct);
        }
      }
      fprintf(__stream,"\n");
    }
    Vec_IntFree(vCover_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void Io_WriteBlifInt( Abc_Ntk_t * pNtk, char * FileName, char * pLutStruct, int fUseHie )
{
    FILE * pFile;
    Vec_Int_t * vCover;
    Abc_Obj_t * pNode, * pLatch;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlifInt(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the model name
    fprintf( pFile, ".model %s\n", Abc_NtkName(pNtk) );
    // write the PIs
    fprintf( pFile, ".inputs" );
    Io_NtkWritePis( pFile, pNtk, 1 );
    fprintf( pFile, "\n" );
    // write the POs
    fprintf( pFile, ".outputs" );
    Io_NtkWritePos( pFile, pNtk, 1 );
    fprintf( pFile, "\n" );
    // write the latches
    if ( Abc_NtkLatchNum(pNtk) )
        fprintf( pFile, "\n" );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        Io_NtkWriteLatch( pFile, pLatch );
    if ( Abc_NtkLatchNum(pNtk) )
        fprintf( pFile, "\n" );
    // write the hierarchy
    vCover = Vec_IntAlloc( (1<<16) );
    if ( fUseHie )
    {
        // write each internal node
        fprintf( pFile, "\n" );
        Abc_NtkForEachNode( pNtk, pNode, i )
            Io_NtkWriteNodeSubckt( pFile, pNode, 0 );
        fprintf( pFile, ".end\n\n" );
        // write models
        Abc_NtkForEachNode( pNtk, pNode, i )
            Io_NtkWriteModelIntStruct( pFile, pNode, vCover, pLutStruct );
        fprintf( pFile, "\n" );
    }
    else
    {
        // write each internal node
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            if ( pLutStruct )
                Io_NtkWriteNodeIntStruct( pFile, pNode, vCover, pLutStruct );
            else
                Io_NtkWriteNodeInt( pFile, pNode, vCover );
        }
        fprintf( pFile, ".end\n\n" );
    }
    Vec_IntFree( vCover );
    fclose( pFile );
}